

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

void __thiscall smf::Option_register::reset(Option_register *this)

{
  this->m_type = 's';
  (this->m_definition)._M_string_length = 0;
  *(this->m_definition)._M_dataplus._M_p = '\0';
  (this->m_defaultOption)._M_string_length = 0;
  *(this->m_defaultOption)._M_dataplus._M_p = '\0';
  (this->m_modifiedOption)._M_string_length = 0;
  *(this->m_modifiedOption)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void Option_register::reset(void) {
	m_type = OPTION_TYPE_string;
	m_definition.clear();
	m_defaultOption.clear();
	m_modifiedOption.clear();
}